

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O3

string * __thiscall Tracker::logSamples(string *__return_storage_ptr__,Tracker *this,string *_track)

{
  iterator iVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  long *plVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string track_name;
  long *local_140;
  undefined8 local_138;
  long local_130;
  undefined8 uStack_128;
  long *local_120;
  undefined8 local_118;
  long local_110;
  undefined8 uStack_108;
  string *local_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  string local_b8;
  string local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
          ::find(&(this->m_data)._M_t,_track);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_100 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if ((_Rb_tree_header *)iVar1._M_node != &(this->m_data)._M_t._M_impl.super__Rb_tree_header) {
    local_58 = local_48;
    local_38 = &__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,*(long *)(iVar1._M_node + 1),
               (long)&(iVar1._M_node[1]._M_parent)->_M_color + *(long *)(iVar1._M_node + 1));
    if (iVar1._M_node[3]._M_left != iVar1._M_node[3]._M_parent) {
      lVar6 = 0;
      uVar9 = 0;
      do {
        local_f8 = local_e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_58,local_50 + (long)local_58);
        std::__cxx11::string::append((char *)&local_f8);
        vera::toString<double>
                  (&local_98,(double *)((long)&(iVar1._M_node[3]._M_parent)->_M_color + lVar6));
        uVar7 = 0xf;
        if (local_f8 != local_e8) {
          uVar7 = local_e8[0];
        }
        if (uVar7 < local_98._M_string_length + local_f0) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            uVar8 = local_98.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < local_98._M_string_length + local_f0) goto LAB_001f1935;
          puVar2 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_f8);
        }
        else {
LAB_001f1935:
          puVar2 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_f8,(ulong)local_98._M_dataplus._M_p);
        }
        local_140 = &local_130;
        plVar3 = puVar2 + 2;
        if ((long *)*puVar2 == plVar3) {
          local_130 = *plVar3;
          uStack_128 = puVar2[3];
        }
        else {
          local_130 = *plVar3;
          local_140 = (long *)*puVar2;
        }
        local_138 = puVar2[1];
        *puVar2 = plVar3;
        puVar2[1] = 0;
        *(undefined1 *)plVar3 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_140);
        puVar4 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar4) {
          local_c8 = *puVar4;
          lStack_c0 = plVar3[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *puVar4;
          local_d8 = (ulong *)*plVar3;
        }
        local_d0 = plVar3[1];
        *plVar3 = (long)puVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        vera::toString<double>
                  (&local_b8,(double *)((long)&(iVar1._M_node[3]._M_parent)->_M_left + lVar6));
        uVar7 = 0xf;
        if (local_d8 != &local_c8) {
          uVar7 = local_c8;
        }
        if (uVar7 < local_b8._M_string_length + local_d0) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            uVar8 = local_b8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < local_b8._M_string_length + local_d0) goto LAB_001f1a5a;
          puVar2 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_d8);
        }
        else {
LAB_001f1a5a:
          puVar2 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_d8,(ulong)local_b8._M_dataplus._M_p);
        }
        local_120 = &local_110;
        plVar3 = puVar2 + 2;
        if ((long *)*puVar2 == plVar3) {
          local_110 = *plVar3;
          uStack_108 = puVar2[3];
        }
        else {
          local_110 = *plVar3;
          local_120 = (long *)*puVar2;
        }
        local_118 = puVar2[1];
        *puVar2 = plVar3;
        puVar2[1] = 0;
        *(undefined1 *)plVar3 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_120);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_68 = *plVar5;
          lStack_60 = plVar3[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *plVar5;
          local_78 = (long *)*plVar3;
        }
        local_70 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_100,(ulong)local_78);
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        if (local_120 != &local_110) {
          operator_delete(local_120,local_110 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if (local_140 != &local_130) {
          operator_delete(local_140,local_130 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_f8 != local_e8) {
          operator_delete(local_f8,local_e8[0] + 1);
        }
        uVar9 = uVar9 + 1;
        lVar6 = lVar6 + 0x18;
      } while (uVar9 < (ulong)(((long)iVar1._M_node[3]._M_left - (long)iVar1._M_node[3]._M_parent >>
                               3) * -0x5555555555555555));
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
  }
  return local_100;
}

Assistant:

std::string Tracker::logSamples(const std::string& _track) {
    std::map<std::string, StatTrack>::iterator it = m_data.find(_track);

    if ( it == m_data.end() )
        return "";

    std::string log = "";
    std::string track_name = it->first;
    
    for (size_t i = 0; i < it->second.samples.size(); i++)
        log +=  track_name + "," + 
                vera::toString(it->second.samples[i].startMs) + "," + 
                vera::toString(it->second.samples[i].durationMs) + "\n";

    return log;
}